

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2.c
# Opt level: O1

void ssh2_queue_global_request_handler(ssh2_connection_state *s,gr_handler_fn_t handler,void *ctx)

{
  outstanding_global_request *poVar1;
  outstanding_global_request **ppoVar2;
  
  poVar1 = (outstanding_global_request *)safemalloc(1,0x18,0);
  poVar1->handler = handler;
  poVar1->ctx = ctx;
  poVar1->next = (outstanding_global_request *)0x0;
  ppoVar2 = &s->globreq_tail->next;
  if (s->globreq_tail == (outstanding_global_request *)0x0) {
    ppoVar2 = &s->globreq_head;
  }
  *ppoVar2 = poVar1;
  s->globreq_tail = poVar1;
  return;
}

Assistant:

void ssh2_queue_global_request_handler(
    struct ssh2_connection_state *s, gr_handler_fn_t handler, void *ctx)
{
    struct outstanding_global_request *ogr =
        snew(struct outstanding_global_request);
    ogr->handler = handler;
    ogr->ctx = ctx;
    ogr->next = NULL;
    if (s->globreq_tail)
        s->globreq_tail->next = ogr;
    else
        s->globreq_head = ogr;
    s->globreq_tail = ogr;
}